

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O3

void __thiscall duckdb::DBConfig::~DBConfig(DBConfig *this)

{
  _Head_base<0UL,_duckdb::CollationBinding_*,_false> _Var1;
  _Head_base<0UL,_duckdb::ArrowTypeExtensionSet_*,_false> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Head_base<0UL,_duckdb::SecretManager_*,_false> _Var4;
  _Head_base<0UL,_duckdb::FileSystem_*,_false> _Var5;
  
  ::std::unique_ptr<duckdb::IndexTypeSet,_std::default_delete<duckdb::IndexTypeSet>_>::~unique_ptr
            (&(this->index_types).
              super_unique_ptr<duckdb::IndexTypeSet,_std::default_delete<duckdb::IndexTypeSet>_>);
  _Var1._M_head_impl =
       (this->collation_bindings).
       super_unique_ptr<duckdb::CollationBinding,_std::default_delete<duckdb::CollationBinding>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::CollationBinding,_std::default_delete<duckdb::CollationBinding>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::CollationBinding_*,_std::default_delete<duckdb::CollationBinding>_>
       .super__Head_base<0UL,_duckdb::CollationBinding_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (CollationBinding *)0x0) {
    if (*(void **)&(_Var1._M_head_impl)->collations != (void *)0x0) {
      operator_delete(*(void **)&(_Var1._M_head_impl)->collations);
    }
    operator_delete(_Var1._M_head_impl);
  }
  (this->collation_bindings).
  super_unique_ptr<duckdb::CollationBinding,_std::default_delete<duckdb::CollationBinding>_>._M_t.
  super___uniq_ptr_impl<duckdb::CollationBinding,_std::default_delete<duckdb::CollationBinding>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::CollationBinding_*,_std::default_delete<duckdb::CollationBinding>_>
  .super__Head_base<0UL,_duckdb::CollationBinding_*,_false>._M_head_impl = (CollationBinding *)0x0;
  ::std::unique_ptr<duckdb::CastFunctionSet,_std::default_delete<duckdb::CastFunctionSet>_>::
  ~unique_ptr(&(this->cast_functions).
               super_unique_ptr<duckdb::CastFunctionSet,_std::default_delete<duckdb::CastFunctionSet>_>
             );
  _Var2._M_head_impl =
       (this->arrow_extensions).
       super_unique_ptr<duckdb::ArrowTypeExtensionSet,_std::default_delete<duckdb::ArrowTypeExtensionSet>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::ArrowTypeExtensionSet,_std::default_delete<duckdb::ArrowTypeExtensionSet>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ArrowTypeExtensionSet_*,_std::default_delete<duckdb::ArrowTypeExtensionSet>_>
       .super__Head_base<0UL,_duckdb::ArrowTypeExtensionSet_*,_false>._M_head_impl;
  if (_Var2._M_head_impl != (ArrowTypeExtensionSet *)0x0) {
    ::std::
    _Hashtable<duckdb::TypeInfo,_std::pair<const_duckdb::TypeInfo,_duckdb::vector<duckdb::ArrowExtensionMetadata,_true>_>,_std::allocator<std::pair<const_duckdb::TypeInfo,_duckdb::vector<duckdb::ArrowExtensionMetadata,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::TypeInfo>,_duckdb::HashTypeInfo,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&((_Var2._M_head_impl)->type_to_info)._M_h);
    ::std::
    _Hashtable<duckdb::ArrowExtensionMetadata,_std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>,_std::allocator<std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::ArrowExtensionMetadata>,_duckdb::HashArrowTypeExtension,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&((_Var2._M_head_impl)->type_extensions)._M_h);
    operator_delete(_Var2._M_head_impl);
  }
  (this->arrow_extensions).
  super_unique_ptr<duckdb::ArrowTypeExtensionSet,_std::default_delete<duckdb::ArrowTypeExtensionSet>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ArrowTypeExtensionSet,_std::default_delete<duckdb::ArrowTypeExtensionSet>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ArrowTypeExtensionSet_*,_std::default_delete<duckdb::ArrowTypeExtensionSet>_>
  .super__Head_base<0UL,_duckdb::ArrowTypeExtensionSet_*,_false>._M_head_impl =
       (ArrowTypeExtensionSet *)0x0;
  ::std::unique_ptr<duckdb::EncodingFunctionSet,_std::default_delete<duckdb::EncodingFunctionSet>_>
  ::~unique_ptr(&(this->encoding_functions).
                 super_unique_ptr<duckdb::EncodingFunctionSet,_std::default_delete<duckdb::EncodingFunctionSet>_>
               );
  ::std::
  unique_ptr<duckdb::CompressionFunctionSet,_std::default_delete<duckdb::CompressionFunctionSet>_>::
  ~unique_ptr(&(this->compression_functions).
               super_unique_ptr<duckdb::CompressionFunctionSet,_std::default_delete<duckdb::CompressionFunctionSet>_>
             );
  p_Var3 = (this->db_cache_entry).internal.
           super___shared_ptr<duckdb::DatabaseCacheEntry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  p_Var3 = (this->encryption_util).internal.
           super___shared_ptr<duckdb::EncryptionUtil,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>_>_>
  ::~vector(&(this->extension_callbacks).
             super_vector<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>_>_>
           );
  p_Var3 = (this->buffer_manager).internal.
           super___shared_ptr<duckdb::BufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  p_Var3 = (this->buffer_pool).internal.
           super___shared_ptr<duckdb::BufferPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::StorageExtension,_std::default_delete<duckdb::StorageExtension>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::StorageExtension,_std::default_delete<duckdb::StorageExtension>,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->storage_extensions)._M_h);
  ::std::
  vector<duckdb::unique_ptr<duckdb::OperatorExtension,_std::default_delete<duckdb::OperatorExtension>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorExtension,_std::default_delete<duckdb::OperatorExtension>,_true>_>_>
  ::~vector(&(this->operator_extensions).
             super_vector<duckdb::unique_ptr<duckdb::OperatorExtension,_std::default_delete<duckdb::OperatorExtension>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorExtension,_std::default_delete<duckdb::OperatorExtension>,_true>_>_>
           );
  p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (this->default_allocator).internal.
           super___shared_ptr<duckdb::Allocator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  ::std::unique_ptr<duckdb::ErrorManager,_std::default_delete<duckdb::ErrorManager>_>::~unique_ptr
            (&(this->error_manager).
              super_unique_ptr<duckdb::ErrorManager,_std::default_delete<duckdb::ErrorManager>_>);
  ::std::vector<duckdb::OptimizerExtension,_std::allocator<duckdb::OptimizerExtension>_>::~vector
            (&(this->optimizer_extensions).
              super_vector<duckdb::OptimizerExtension,_std::allocator<duckdb::OptimizerExtension>_>)
  ;
  ::std::vector<duckdb::ParserExtension,_std::allocator<duckdb::ParserExtension>_>::~vector
            (&(this->parser_extensions).
              super_vector<duckdb::ParserExtension,_std::allocator<duckdb::ParserExtension>_>);
  DBConfigOptions::~DBConfigOptions(&this->options);
  ::std::unique_ptr<duckdb::Allocator,_std::default_delete<duckdb::Allocator>_>::~unique_ptr
            (&(this->allocator).
              super_unique_ptr<duckdb::Allocator,_std::default_delete<duckdb::Allocator>_>);
  _Var4._M_head_impl =
       (this->secret_manager).
       super_unique_ptr<duckdb::SecretManager,_std::default_delete<duckdb::SecretManager>_>._M_t.
       super___uniq_ptr_impl<duckdb::SecretManager,_std::default_delete<duckdb::SecretManager>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::SecretManager_*,_std::default_delete<duckdb::SecretManager>_>.
       super__Head_base<0UL,_duckdb::SecretManager_*,_false>._M_head_impl;
  if (_Var4._M_head_impl != (SecretManager *)0x0) {
    (**(code **)((long)(_Var4._M_head_impl)->_vptr_SecretManager + 8))();
  }
  (this->secret_manager).
  super_unique_ptr<duckdb::SecretManager,_std::default_delete<duckdb::SecretManager>_>._M_t.
  super___uniq_ptr_impl<duckdb::SecretManager,_std::default_delete<duckdb::SecretManager>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SecretManager_*,_std::default_delete<duckdb::SecretManager>_>.
  super__Head_base<0UL,_duckdb::SecretManager_*,_false>._M_head_impl = (SecretManager *)0x0;
  _Var5._M_head_impl =
       (this->file_system).
       super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
       super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>.
       super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl;
  if (_Var5._M_head_impl != (FileSystem *)0x0) {
    (*(_Var5._M_head_impl)->_vptr_FileSystem[1])();
  }
  (this->file_system).super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>
  ._M_t.super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>.
  super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl = (FileSystem *)0x0;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionOption>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionOption>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->extension_parameters)._M_h);
  ::std::vector<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>::~vector
            (&(this->replacement_scans).
              super_vector<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>);
  return;
}

Assistant:

DBConfig::~DBConfig() {
}